

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

Matrix<double,_3,_1> __thiscall
Matrix<double,_3,_1>::operator+(Matrix<double,_3,_1> *this,Matrix<double,_3,_1> *matrix)

{
  double dVar1;
  Matrix<double,_3,_1> MVar2;
  double *pdVar3;
  ostream *poVar4;
  int i;
  int row;
  char *pcVar5;
  int j;
  int iVar6;
  int iVar7;
  Matrix<double,_3,_1> local_40;
  
  iVar6 = matrix->rows;
  if (iVar6 != 0) {
    iVar7 = matrix->cols;
    if (iVar7 != 0) {
      if ((iVar6 == this->rows) && (iVar7 == this->cols)) {
        local_40.rows = 3;
        local_40.cols = 1;
        local_40.data = (double *)operator_new__(0x18);
        for (row = 0; row < iVar6; row = row + 1) {
          for (iVar6 = 0; iVar6 < iVar7; iVar6 = iVar6 + 1) {
            pdVar3 = operator()(this,row,iVar6);
            dVar1 = *pdVar3;
            pdVar3 = operator()(matrix,row,iVar6);
            SetElement(&local_40,row,iVar6,dVar1 + *pdVar3);
            iVar7 = this->cols;
          }
          iVar6 = this->rows;
        }
        MVar2.data = local_40.data;
        MVar2.rows = local_40.rows;
        MVar2.cols = local_40.cols;
        return MVar2;
      }
      pcVar5 = "can not plus matrix with different rows/cols";
      goto LAB_0010ac29;
    }
  }
  pcVar5 = "can not plus two empty matrix!";
LAB_0010ac29:
  poVar4 = std::operator<<((ostream *)&std::cerr,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(-1);
}

Assistant:

int Matrix<Type, _0, _1>::row() const
{
    return this->rows;
}